

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r20.cpp
# Opt level: O2

void __thiscall r20_order_Test::TestBody(r20_order_Test *this)

{
  void *pvVar1;
  ulong uVar2;
  char *message;
  undefined8 *puVar3;
  allocator local_8a;
  allocator local_89;
  AssertionResult gtest_ar;
  size_t unit_count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  unit_count = 0;
  pvVar1 = units::detail::r20rawData(&unit_count);
  puVar3 = (undefined8 *)((long)pvVar1 + 0x38);
  for (uVar2 = 1; uVar2 < unit_count; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string((string *)&local_70,(char *)puVar3[-4],&local_89);
    std::__cxx11::string::string((string *)&local_50,(char *)*puVar3,&local_8a);
    testing::internal::CmpHelperLT<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"std::string(std::get<0>(r20data[ii - 1]))",
               "std::string(std::get<0>(r20data[ii]))",&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_r20.cpp",
                 0x1a,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    puVar3 = puVar3 + 4;
  }
  return;
}

Assistant:

TEST(r20, order)
{
    std::size_t unit_count{0};
    const void* r20 = units::detail::r20rawData(unit_count);
    const auto* r20data = reinterpret_cast<const unitD*>(r20);
    for (size_t ii = 1; ii < unit_count; ++ii) {
        EXPECT_LT(
            std::string(std::get<0>(r20data[ii - 1])),
            std::string(std::get<0>(r20data[ii])));
    }
}